

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.c
# Opt level: O0

unsigned_long find_last_bit(unsigned_long *addr,unsigned_long size)

{
  int iVar1;
  uint64_t val;
  unsigned_long tmp;
  unsigned_long words;
  unsigned_long size_local;
  unsigned_long *addr_local;
  
  tmp = size >> 6;
  if ((size & 0x3f) == 0) goto LAB_01354177;
  val = addr[tmp] & 0xffffffffffffffffU >> (0x40 - ((byte)size & 0x3f) & 0x3f);
  while( true ) {
    if (val != 0) {
      iVar1 = clz64(val);
      return (tmp * 0x40 + 0x3f) - (long)iVar1;
    }
LAB_01354177:
    if (tmp == 0) break;
    val = addr[tmp - 1];
    tmp = tmp - 1;
  }
  return size;
}

Assistant:

unsigned long find_last_bit(const unsigned long *addr, unsigned long size)
{
    unsigned long words;
    unsigned long tmp;

    /* Start at final word. */
    words = size / BITS_PER_LONG;

    /* Partial final word? */
    if (size & (BITS_PER_LONG-1)) {
        tmp = (addr[words] & (~0UL >> (BITS_PER_LONG
                                       - (size & (BITS_PER_LONG-1)))));
        if (tmp) {
            goto found;
        }
    }

    while (words) {
        tmp = addr[--words];
        if (tmp) {
        found:
            return words * BITS_PER_LONG + BITS_PER_LONG - 1 - clzl(tmp);
        }
    }

    /* Not found */
    return size;
}